

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O0

GLvoid __thiscall gl4cts::anon_unknown_0::GatherBase::CreateTexture2DInt(GatherBase *this,bool rect)

{
  GLenum target_00;
  int internalformat;
  reference pixels_00;
  undefined1 local_a8 [8];
  IVec4 data [4];
  allocator<tcu::Vector<int,_4>_> local_51;
  Vector<int,_4> local_50;
  undefined1 local_40 [8];
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> pixels;
  int i;
  GLenum target;
  GLint size;
  GLint csize;
  GLenum internal_format;
  bool rect_local;
  GatherBase *this_local;
  
  internalformat = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x21])()
  ;
  i = 0x20;
  pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0xde1;
  if (rect) {
    pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0x84f5;
  }
  glu::CallLogWrapper::glGenTextures
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->tex);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,this->tex);
  if (rect) {
    glu::CallLogWrapper::glTexImage2D
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0,internalformat,0x20,0x20,0
               ,0x8d99,0x1404,(void *)0x0);
  }
  else {
    pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    for (; 0 < i; i = i / 2) {
      glu::CallLogWrapper::glTexImage2D
                (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                 pixels.
                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                 (int)pixels.
                      super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,internalformat,i,i,0,0x8d99
                 ,0x1404,(void *)0x0);
      pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           (int)pixels.
                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage + 1;
    }
  }
  tcu::Vector<int,_4>::Vector(&local_50,999);
  std::allocator<tcu::Vector<int,_4>_>::allocator(&local_51);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_40,0x400,
             &local_50,&local_51);
  std::allocator<tcu::Vector<int,_4>_>::~allocator(&local_51);
  target_00 = pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  pixels_00 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                        ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                         local_40,0);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,target_00,
             0,0,0,0x20,0x20,0x8d99,0x1404,pixels_00);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_a8,0xc,0xd,0xe,0xf);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(data[0].m_data + 2),8,9,10,0xb);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(data[1].m_data + 2),0,1,2,3);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(data[2].m_data + 2),4,5,6,7);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0,0x16,0x19,2,2,0x8d99,0x1404,
             local_a8);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0,0x10,10,1,1,0x8d99,0x1404,
             local_a8);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0,0xb,2,1,1,0x8d99,0x1404,
             data[0].m_data + 2);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0,0x18,0xd,1,1,0x8d99,0x1404,
             data[1].m_data + 2);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0,9,0xe,1,1,0x8d99,0x1404,
             data[2].m_data + 2);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0x2803,0x812f);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0x8072,0x812f);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0x2800,0x2600);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_40);
  return;
}

Assistant:

virtual GLvoid CreateTexture2DInt(bool rect = false)
	{
		GLenum		internal_format = InternalFormat();
		const GLint csize			= 32;
		GLint		size			= csize;
		GLenum		target			= rect ? GL_TEXTURE_RECTANGLE : GL_TEXTURE_2D;

		glGenTextures(1, &tex);
		glBindTexture(target, tex);
		if (!rect)
		{
			for (int i = 0; size > 0; ++i, size /= 2)
			{
				glTexImage2D(target, i, internal_format, size, size, 0, GL_RGBA_INTEGER, GL_INT, 0);
			}
		}
		else
		{
			glTexImage2D(target, 0, internal_format, size, size, 0, GL_RGBA_INTEGER, GL_INT, 0);
		}
		std::vector<IVec4> pixels(csize * csize, IVec4(999));
		glTexSubImage2D(target, 0, 0, 0, csize, csize, GL_RGBA_INTEGER, GL_INT, &pixels[0]);

		IVec4 data[4] = { IVec4(12, 13, 14, 15), IVec4(8, 9, 10, 11), IVec4(0, 1, 2, 3), IVec4(4, 5, 6, 7) };

		glTexSubImage2D(target, 0, 22, 25, 2, 2, GL_RGBA_INTEGER, GL_INT, data);
		glTexSubImage2D(target, 0, 16, 10, 1, 1, GL_RGBA_INTEGER, GL_INT, data + 0);
		glTexSubImage2D(target, 0, 11, 2, 1, 1, GL_RGBA_INTEGER, GL_INT, data + 1);
		glTexSubImage2D(target, 0, 24, 13, 1, 1, GL_RGBA_INTEGER, GL_INT, data + 2);
		glTexSubImage2D(target, 0, 9, 14, 1, 1, GL_RGBA_INTEGER, GL_INT, data + 3);

		glTexParameteri(target, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(target, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	}